

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O1

uint32_t __thiscall
icu_63::CollationRootElements::getSecondaryAfter
          (CollationRootElements *this,int32_t index,uint32_t s)

{
  uint uVar1;
  uint uVar2;
  uint32_t *puVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint32_t *puVar7;
  byte bVar8;
  byte bVar9;
  
  uVar6 = (ulong)(uint)index;
  puVar3 = this->elements;
  if (index == 0) {
    uVar6 = (ulong)(int)puVar3[1];
    uVar4 = (ulong)puVar3[uVar6];
    puVar7 = (uint32_t *)0x10000;
  }
  else {
    uVar1 = puVar3[(long)index + 1];
    uVar2 = uVar1;
    if (0x50004ff < uVar1) {
      uVar2 = 0x5000500;
    }
    uVar4 = (ulong)uVar2;
    if (-1 < (char)uVar1) {
      uVar4 = 0x5000500;
    }
    puVar7 = (uint32_t *)((ulong)*(byte *)((long)puVar3 + 0x12) << 8);
  }
  do {
    if (s < (uint)(uVar4 >> 0x10)) {
      bVar8 = 0;
      puVar3 = (uint32_t *)(uVar4 >> 0x10);
    }
    else {
      iVar5 = (int)uVar6;
      uVar6 = (ulong)(iVar5 + 1);
      uVar4 = (ulong)this->elements[(long)iVar5 + 1];
      bVar9 = (byte)this->elements[(long)iVar5 + 1];
      bVar8 = bVar9 >> 7;
      puVar3 = (uint32_t *)((ulong)puVar3 & 0xffffffff);
      if (-1 < (char)bVar9) {
        puVar3 = puVar7;
      }
    }
  } while (bVar8 != 0);
  return (uint32_t)puVar3;
}

Assistant:

uint32_t
CollationRootElements::getSecondaryAfter(int32_t index, uint32_t s) const {
    uint32_t secTer;
    uint32_t secLimit;
    if(index == 0) {
        // primary = 0
        U_ASSERT(s != 0);
        index = (int32_t)elements[IX_FIRST_SECONDARY_INDEX];
        secTer = elements[index];
        // Gap at the end of the secondary CE range.
        secLimit = 0x10000;
    } else {
        U_ASSERT(index >= (int32_t)elements[IX_FIRST_PRIMARY_INDEX]);
        secTer = getFirstSecTerForPrimary(index + 1);
        // If this is an explicit sec/ter unit, then it will be read once more.
        // Gap for secondaries of primary CEs.
        secLimit = getSecondaryBoundary();
    }
    for(;;) {
        uint32_t sec = secTer >> 16;
        if(sec > s) { return sec; }
        secTer = elements[++index];
        if((secTer & SEC_TER_DELTA_FLAG) == 0) { return secLimit; }
    }
}